

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O1

void test_z5_standart_field_constructors<Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,void>>
               (void)

{
  uint __tmp;
  uint __old_val;
  Element_conflict EVar1;
  Shared_Zp_field_element<unsigned_int,_void> *local_210;
  Shared_Zp_field_element<unsigned_int,_void> z5_s1;
  Shared_Zp_field_element<unsigned_int,_void> *local_200;
  Shared_Zp_field_element<unsigned_int,_void> z5_m1;
  Shared_Zp_field_element<unsigned_int,_void> z5_c2;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  Shared_Zp_field_element<unsigned_int,_void> **local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8;
  undefined8 *local_1c0;
  Shared_Zp_field_element<unsigned_int,_void> **local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char *local_198;
  undefined1 local_190 [8];
  undefined8 local_188;
  shared_count sStack_180;
  Shared_Zp_field_element<unsigned_int,_void> z5_c3;
  Shared_Zp_field_element<unsigned_int,_void> z5_d;
  Shared_Zp_field_element<unsigned_int,_void> local_170;
  Shared_Zp_field_element<unsigned_int,_void> z5_v;
  char *local_168;
  char *local_160;
  Shared_Zp_field_element<unsigned_int,_void> z5_s2;
  Shared_Zp_field_element<unsigned_int,_void> z5_m2;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  z5_d.element_ = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x45);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_v.element_ = 0;
  local_190[0] = z5_d.element_ == 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1b8 = &local_210;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &z5_d;
  local_200 = &z5_v;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_v.element_ = 7;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      8) {
    z5_v.element_ =
         (Element_conflict)
         (7 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x49);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_c2.element_ = 2;
  EVar1 = 2;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      3) {
    EVar1 = (Element_conflict)
            (2 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_190[0] = EVar1 == z5_v.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &z5_v;
  local_200 = &z5_c2;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x49,1,2,2,"z5_v",&local_1d0,"2",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_d.element_ = 7;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      8) {
    z5_d.element_ =
         (Element_conflict)
         (7 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x4b);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_c2.element_ = 2;
  EVar1 = 2;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      3) {
    EVar1 = (Element_conflict)
            (2 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_190[0] = EVar1 == z5_d.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_210 = &z5_d;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &z5_c2;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x4b,1,2,2,"z5_d",&local_1d0,"2",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_c2.element_ = 7;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      8) {
    z5_c2.element_ =
         (Element_conflict)
         (7 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x50);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_c3.element_ = 2;
  EVar1 = 2;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      3) {
    EVar1 = (Element_conflict)
            (2 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_190[0] = EVar1 == z5_c2.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  EVar1 = 2;
  local_210 = &z5_c2;
  local_200 = &z5_c3;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x50,1,2,2,"z5_c2",&local_1d0,"2",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_c3 = z5_c2;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x52);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_m1.element_ = 2;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      3) {
    EVar1 = (Element_conflict)
            (2 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_190[0] = EVar1 == z5_c3.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_200 = &z5_m1;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  local_210 = &z5_c3;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x52,1,2,2,"z5_c3",&local_1d0,"2",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_m2.element_ = 7;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      8) {
    z5_m2.element_ =
         (Element_conflict)
         (7 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  z5_m1.element_ = 0;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x57);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_s1.element_ = 2;
  EVar1 = 2;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      3) {
    EVar1 = (Element_conflict)
            (2 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_210 = &z5_m2;
  local_190[0] = EVar1 == z5_m2.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_200 = &z5_s1;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x57,1,2,2,"z5_m2",&local_1d0,"2",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x58);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_190[0] = z5_m1.element_ == 0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  z5_s1.element_ = 0;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_210 = &z5_m1;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_200 = &z5_s1;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x58,1,2,2,"z5_m1",&local_1d0,"0",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  z5_s2.element_ = 4;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      5) {
    z5_s2.element_ =
         (Element_conflict)
         (4 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  z5_s1.element_ = 8;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      9) {
    z5_s1.element_ =
         (Element_conflict)
         (8 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                     characteristic_);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x5e);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_170.element_ = 4;
  EVar1 = 4;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      5) {
    EVar1 = (Element_conflict)
            (4 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_210 = &z5_s2;
  local_190[0] = EVar1 == z5_s2.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_170;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x5e,1,2,2,"z5_s2",&local_1d0,"4",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_138 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x5f);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00132ae0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_170.element_ = 3;
  EVar1 = 3;
  if ((int)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::characteristic_ <
      4) {
    EVar1 = (Element_conflict)
            (3 % (ulong)Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::
                        characteristic_);
  }
  local_190[0] = EVar1 == z5_s1.element_;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_160 = "";
  local_210 = &z5_s1;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00132ce0;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_00132aa0;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_170;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_168,0x5f,1,2,2,"z5_s1",&local_1d0,"3",&local_1f0);
  boost::detail::shared_count::~shared_count(&sStack_180);
  return;
}

Assistant:

void test_z5_standart_field_constructors() {
  // default constructor
  Z5 z5_d;
  BOOST_CHECK_EQUAL(z5_d, 0);

  // value constructor
  Z5 z5_v(7);
  BOOST_CHECK_EQUAL(z5_v, 2);
  z5_d = 7;
  BOOST_CHECK_EQUAL(z5_d, 2);

  // copy constructor
  Z5 z5_c1(7);
  Z5 z5_c2 = z5_c1;
  BOOST_CHECK_EQUAL(z5_c2, 2);
  Z5 z5_c3(z5_c2);
  BOOST_CHECK_EQUAL(z5_c3, 2);

  // move constructor
  Z5 z5_m1(7);
  Z5 z5_m2(std::move(z5_m1));
  BOOST_CHECK_EQUAL(z5_m2, 2);
  BOOST_CHECK_EQUAL(z5_m1, 0);

  // swap
  Z5 z5_s1(4);
  Z5 z5_s2(8);
  swap(z5_s1, z5_s2);
  BOOST_CHECK_EQUAL(z5_s2, 4);
  BOOST_CHECK_EQUAL(z5_s1, 3);
}